

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall
ObjectTest_basic_value_constructor_set_Test::~ObjectTest_basic_value_constructor_set_Test
          (ObjectTest_basic_value_constructor_set_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectTest, basic_value_constructor_set) {
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::set<bool>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::set<signed char>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::set<unsigned char>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::set<short>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::set<int>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::set<long>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::set<long long>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::set<intmax_t>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::set<float>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::set<double>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::set<long double>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::set<std::u8string>);
	OBJECT_BASIC_VALUE_CONSTRUCTOR_TEST(std::set<object>);
}